

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  __first2;
  bool bVar2;
  _Self __tmp;
  Type *pTVar3;
  mapped_type *pmVar4;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  Type *pTVar5;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  _Var6;
  iterator iVar7;
  size_t *psVar8;
  LogMessage *pLVar9;
  long *plVar10;
  undefined7 in_register_00000009;
  undefined1 *puVar11;
  int iVar12;
  int iVar13;
  undefined1 *puVar14;
  size_t sVar15;
  bool bVar16;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  LogFinisher local_91;
  ModelDescription *local_90;
  RepeatedPtrFieldBase *local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_78;
  LogMessage local_70;
  _Base_ptr local_38;
  
  local_88 = (RepeatedPtrFieldBase *)
             CONCAT44(local_88._4_4_,
                      (int)CONCAT71(in_register_00000009,useInputAndOutputConstraints));
  iVar13 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  this->numColors = iVar13;
  local_78 = &this->blobColors;
  p_Var1 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &this->blobShapes;
  local_38 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70.level_ = LOGLEVEL_INFO;
  local_90 = interface;
  if (0 < iVar13) {
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->input_).super_RepeatedPtrFieldBase,local_70.level_);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](local_80,(key_type *)
                                     ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
      ShapeConstraint::setName
                (pmVar4,(string *)((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[](local_78,(key_type *)
                                      ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                            );
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_00,(int *)&local_70);
      if ((char)local_88 != '\0') {
        puVar14 = (undefined1 *)pTVar3->type_;
        if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
          puVar14 = Specification::_FeatureType_default_instance_;
        }
        ShapeConstraint::updateConstraint(pmVar4,(FeatureType *)puVar14);
      }
      local_70.level_ = local_70.level_ + LOGLEVEL_WARNING;
    } while ((int)local_70.level_ < (local_90->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)&local_70,&local_78->_M_t);
    iVar13 = (layers->super_RepeatedPtrFieldBase).current_size_;
    if (0 < iVar13) {
      iVar12 = 0;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (&layers->super_RepeatedPtrFieldBase,iVar12);
        PassColorsDown(this,pTVar5);
        ProcessLayer(this,pTVar5);
        iVar12 = iVar12 + 1;
        iVar13 = (layers->super_RepeatedPtrFieldBase).current_size_;
      } while (iVar12 < iVar13);
    }
    while (0 < iVar13) {
      iVar13 = iVar13 + -1;
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar13);
      PassColorsUp(this,pTVar5);
      ProcessLayer(this,pTVar5);
    }
    __first2._M_node = (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)__first2._M_node == p_Var1) {
      bVar16 = true;
    }
    else {
      iVar13 = this->numColors;
      _Var6._M_node = __first2._M_node;
      do {
        bVar16 = iVar13 == *(int *)&_Var6._M_node[3]._M_parent;
        if (!bVar16) break;
        _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node);
      } while ((_Rb_tree_header *)_Var6._M_node != p_Var1);
    }
    if (local_70.message_.field_2._M_allocated_capacity ==
        (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      bVar2 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )local_70.message_._M_dataplus._M_p,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )&local_70.filename_,__first2);
    }
    else {
      bVar2 = false;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 *)&local_70);
  } while (!bVar16 && bVar2 == false);
  if (((char)local_88 != '\0') && (0 < (local_90->output_).super_RepeatedPtrFieldBase.current_size_)
     ) {
    local_88 = &(local_90->output_).super_RepeatedPtrFieldBase;
    iVar13 = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (local_88,iVar13);
      iVar12 = std::__cxx11::string::compare
                         ((string *)((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (((iVar12 != 0) &&
          (iVar12 = std::__cxx11::string::compare
                              ((string *)
                               ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)),
          iVar12 != 0)) &&
         (iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                  ::find(&local_80->_M_t,
                         (key_type *)((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
         , iVar7._M_node != local_38)) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                 ::at(local_80,(key_type *)
                               ((ulong)(pTVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        puVar14 = (undefined1 *)pTVar3->type_;
        if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
          puVar14 = Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar14)->_oneof_case_[0] == 4) {
          iVar12 = ((((FeatureType *)puVar14)->Type_).imagetype_)->colorspace_;
          sVar15 = (ulong)(iVar12 != 10) * 2 + 1;
          if (iVar12 == 0x28) {
            sVar15 = 1;
          }
          ShapeConstraint::setChannel(pmVar4,sVar15);
          puVar14 = (undefined1 *)pTVar3->type_;
          if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
            puVar14 = Specification::_FeatureType_default_instance_;
          }
          puVar11 = Specification::_ImageFeatureType_default_instance_;
          if (((FeatureType *)puVar14)->_oneof_case_[0] == 4) {
            puVar11 = (undefined1 *)(((FeatureType *)puVar14)->Type_).imagetype_;
          }
          ShapeConstraint::setHeight(pmVar4,((ImageFeatureType *)puVar11)->height_);
          puVar14 = (undefined1 *)pTVar3->type_;
          if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
            puVar14 = Specification::_FeatureType_default_instance_;
          }
          puVar11 = Specification::_ImageFeatureType_default_instance_;
          if (((FeatureType *)puVar14)->_oneof_case_[0] == 4) {
            puVar11 = (undefined1 *)(((FeatureType *)puVar14)->Type_).imagetype_;
          }
          ShapeConstraint::setWidth(pmVar4,((ImageFeatureType *)puVar11)->width_);
        }
        else {
          puVar11 = Specification::_ArrayFeatureType_default_instance_;
          if (((FeatureType *)puVar14)->_oneof_case_[0] == 5) {
            puVar11 = (undefined1 *)(((FeatureType *)puVar14)->Type_).multiarraytype_;
          }
          iVar12 = (((ArrayFeatureType *)puVar11)->shape_).current_size_;
          if (iVar12 == 1) {
            psVar8 = (size_t *)
                     google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar11)->shape_);
            ShapeConstraint::setChannel(pmVar4,*psVar8);
            sVar15 = 1;
            ShapeConstraint::setHeight(pmVar4,1);
          }
          else {
            if (iVar12 != 3) goto LAB_002f92b8;
            psVar8 = (size_t *)
                     google::protobuf::RepeatedField<long>::elements
                               (&((ArrayFeatureType *)puVar11)->shape_);
            ShapeConstraint::setChannel(pmVar4,*psVar8);
            puVar14 = (undefined1 *)pTVar3->type_;
            if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
              puVar14 = Specification::_FeatureType_default_instance_;
            }
            puVar11 = Specification::_ArrayFeatureType_default_instance_;
            if (((FeatureType *)puVar14)->_oneof_case_[0] == 5) {
              puVar11 = (undefined1 *)(((FeatureType *)puVar14)->Type_).multiarraytype_;
            }
            if ((((ArrayFeatureType *)puVar11)->shape_).current_size_ < 2) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x280);
              pLVar9 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_70,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
              google::protobuf::internal::LogMessage::~LogMessage(&local_70);
            }
            plVar10 = google::protobuf::RepeatedField<long>::elements
                                (&((ArrayFeatureType *)puVar11)->shape_);
            ShapeConstraint::setHeight(pmVar4,plVar10[1]);
            puVar14 = (undefined1 *)pTVar3->type_;
            if ((FeatureType *)puVar14 == (FeatureType *)0x0) {
              puVar14 = Specification::_FeatureType_default_instance_;
            }
            puVar11 = Specification::_ArrayFeatureType_default_instance_;
            if (((FeatureType *)puVar14)->_oneof_case_[0] == 5) {
              puVar11 = (undefined1 *)(((FeatureType *)puVar14)->Type_).multiarraytype_;
            }
            if ((((ArrayFeatureType *)puVar11)->shape_).current_size_ < 3) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_70,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x280);
              pLVar9 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_70,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_91,pLVar9);
              google::protobuf::internal::LogMessage::~LogMessage(&local_70);
            }
            plVar10 = google::protobuf::RepeatedField<long>::elements
                                (&((ArrayFeatureType *)puVar11)->shape_);
            sVar15 = plVar10[2];
          }
          ShapeConstraint::setWidth(pmVar4,sVar15);
        }
      }
LAB_002f92b8:
      iVar13 = iVar13 + 1;
    } while (iVar13 < (local_90->output_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                auto colorspace = desc.type().imagetype().colorspace();
                if (colorspace == Specification::ImageFeatureType_ColorSpace_GRAYSCALE ||
                    colorspace == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}